

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O2

int ecx_readPDOmap(ecx_contextt *context,uint16 Slave,int *Osize,int *Isize)

{
  long lVar1;
  uint *puVar2;
  long lVar3;
  int iVar4;
  uint8 uVar5;
  uint uVar6;
  uint8 uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint8 local_66;
  byte local_65;
  int rdl;
  int *local_60;
  ulong local_58;
  int *local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  *Isize = 0;
  *Osize = 0;
  rdl = 1;
  local_65 = 0;
  local_60 = Osize;
  local_50 = Isize;
  iVar4 = ecx_SDOread(context,Slave,0x1c00,'\0','\0',&rdl,&local_65,700000);
  if (2 < local_65 && 0 < iVar4) {
    local_40 = (ulong)Slave * 0x148;
    local_38 = 8;
    if ((ulong)(byte)(local_65 - 1) < 8) {
      local_38 = (ulong)(byte)(local_65 - 1);
    }
    local_38 = ~local_38;
    local_58 = 0;
    lVar1 = 2;
    do {
      lVar10 = lVar1;
      lVar1 = local_38 + lVar10;
      lVar9 = 0;
      do {
        lVar8 = lVar9;
        if (lVar1 + lVar8 == 0) goto LAB_00106569;
        rdl = 1;
        local_66 = '\0';
        iVar4 = ecx_SDOread(context,Slave,0x1c00,(char)lVar10 + (char)lVar8 + '\x01','\0',&rdl,
                            &local_66,700000);
        lVar3 = local_40;
        lVar9 = lVar8 + 1;
      } while (iVar4 < 1);
      lVar1 = lVar10 + lVar9;
      uVar6 = (uint)(byte)local_58;
      local_58 = (ulong)uVar6;
      if (local_66 == '\x02') {
        local_58 = 1;
      }
      if (lVar1 != 3) {
        local_58 = (ulong)uVar6;
      }
      uVar7 = (char)local_58 + local_66;
      if (local_66 == '\0') {
        uVar7 = '\0';
      }
      uVar5 = uVar7;
      if (uVar7 == '\0') {
        uVar5 = '\x03';
      }
      if (lVar1 != 3) {
        uVar5 = uVar7;
      }
      uVar7 = uVar5;
      if (uVar5 == '\0') {
        uVar7 = '\x04';
      }
      if (lVar1 != 4) {
        uVar7 = uVar5;
      }
      context->slavelist->SMtype[lVar8 + local_40 + lVar10] = uVar7;
      if (uVar7 == '\0') {
        puVar2 = (uint *)((long)&context->slavelist->SM[lVar10 + lVar8].SMflags + local_40);
        *puVar2 = *puVar2 & 0xfffeffff;
      }
      else if ((byte)(uVar7 - 3) < 2) {
        local_66 = uVar7;
        local_48 = lVar1;
        iVar4 = ecx_readPDOassign(context,Slave,(short)lVar10 + (short)lVar9 + 0x1c0f);
        lVar1 = local_48;
        if (iVar4 != 0) {
          *(short *)((long)&context->slavelist->SM[lVar10 + lVar8].SMlength + lVar3) =
               (short)((iVar4 + 7) / 8);
          if (uVar7 == '\x03') {
            *local_60 = *local_60 + iVar4;
          }
          else {
            *local_50 = *local_50 + iVar4;
          }
        }
      }
    } while( true );
  }
LAB_00106569:
  if ((*local_50 < 1) && (*local_60 < 1)) {
    iVar4 = 0;
  }
  else {
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int ecx_readPDOmap(ecx_contextt *context, uint16 Slave, int *Osize, int *Isize)
{
   int wkc, rdl;
   int retVal = 0;
   uint8 nSM, iSM, tSM;
   int Tsize;
   uint8 SMt_bug_add;
   
   *Isize = 0;
   *Osize = 0;
   SMt_bug_add = 0;
   rdl = sizeof(nSM); nSM = 0;
   /* read SyncManager Communication Type object count */
   wkc = ecx_SDOread(context, Slave, ECT_SDO_SMCOMMTYPE, 0x00, FALSE, &rdl, &nSM, EC_TIMEOUTRXM);
   /* positive result from slave ? */
   if ((wkc > 0) && (nSM > 2))
   {
      /* make nSM equal to number of defined SM */
      nSM--;
      /* limit to maximum number of SM defined, if true the slave can't be configured */
      if (nSM > EC_MAXSM)
         nSM = EC_MAXSM;
      /* iterate for every SM type defined */
      for (iSM = 2 ; iSM <= nSM ; iSM++)
      {
         rdl = sizeof(tSM); tSM = 0;
         /* read SyncManager Communication Type */
         wkc = ecx_SDOread(context, Slave, ECT_SDO_SMCOMMTYPE, iSM + 1, FALSE, &rdl, &tSM, EC_TIMEOUTRXM);
         if (wkc > 0)
         {
// start slave bug prevention code, remove if possible            
            if((iSM == 2) && (tSM == 2)) // SM2 has type 2 == mailbox out, this is a bug in the slave!
            {   
               SMt_bug_add = 1; // try to correct, this works if the types are 0 1 2 3 and should be 1 2 3 4
            }
            if(tSM)
            {   
               tSM += SMt_bug_add; // only add if SMt > 0
            }
            if((iSM == 2) && (tSM == 0)) // SM2 has type 0, this is a bug in the slave!
            {   
               tSM = 3;
            }
            if((iSM == 3) && (tSM == 0)) // SM3 has type 0, this is a bug in the slave!
            {   
               tSM = 4;
            }
// end slave bug prevention code            

            context->slavelist[Slave].SMtype[iSM] = tSM;
            /* check if SM is unused -> clear enable flag */
            if (tSM == 0)
            {
               context->slavelist[Slave].SM[iSM].SMflags = 
                  htoel( etohl(context->slavelist[Slave].SM[iSM].SMflags) & EC_SMENABLEMASK);
            }
            if ((tSM == 3) || (tSM == 4))
            {
               /* read the assign PDO */
               Tsize = ecx_readPDOassign(context, Slave, ECT_SDO_PDOASSIGN + iSM );
               /* if a mapping is found */
               if (Tsize)
               {
                  context->slavelist[Slave].SM[iSM].SMlength = htoes((Tsize + 7) / 8);
                  if (tSM == 3)
                  {  
                     /* we are doing outputs */
                     *Osize += Tsize;
                  }
                  else
                  {
                     /* we are doing inputs */
                     *Isize += Tsize;
                  }   
               }   
            }   
         }   
      }
   }

   /* found some I/O bits ? */
   if ((*Isize > 0) || (*Osize > 0))
   {
      retVal = 1;
   }
      
   return retVal;
}